

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O1

void If_CluMoveVar(word *pF,int nVars,int *Var2Pla,int *Pla2Var,int v,int p)

{
  ulong *puVar1;
  word *pwVar2;
  uint uVar3;
  word *pIn;
  ulong uVar4;
  int iVar5;
  word *pOut;
  bool bVar6;
  word pG [1024];
  word local_2038 [1025];
  
  if ((v < 0) || (nVars <= v)) {
    __assert_fail("v >= 0 && v < nVars",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec16.c"
                  ,0x336,"void If_CluMoveVar(word *, int, int *, int *, int, int)");
  }
  iVar5 = Var2Pla[(uint)v];
  if (iVar5 < p) {
    bVar6 = false;
    pwVar2 = local_2038;
    pOut = pF;
    do {
      pIn = pOut;
      pOut = pwVar2;
      If_CluSwapAdjacent(pOut,pIn,iVar5,nVars);
      Var2Pla[Pla2Var[iVar5]] = Var2Pla[Pla2Var[iVar5]] + 1;
      Var2Pla[Pla2Var[(long)iVar5 + 1]] = Var2Pla[Pla2Var[(long)iVar5 + 1]] + -1;
      puVar1 = (ulong *)(Pla2Var + iVar5);
      *puVar1 = *puVar1 << 0x20 | *puVar1 >> 0x20;
      bVar6 = (bool)(bVar6 ^ 1);
      iVar5 = Var2Pla[(uint)v];
      pwVar2 = pIn;
    } while (iVar5 < p);
  }
  else {
    bVar6 = false;
    pIn = local_2038;
    pOut = pF;
  }
  iVar5 = Var2Pla[(uint)v];
  while (pwVar2 = pIn, p < iVar5) {
    If_CluSwapAdjacent(pwVar2,pOut,iVar5 + -1,nVars);
    Var2Pla[Pla2Var[(long)iVar5 + -1]] = Var2Pla[Pla2Var[(long)iVar5 + -1]] + 1;
    Var2Pla[Pla2Var[iVar5]] = Var2Pla[Pla2Var[iVar5]] + -1;
    puVar1 = (ulong *)(Pla2Var + (long)iVar5 + -1);
    *puVar1 = *puVar1 << 0x20 | *puVar1 >> 0x20;
    bVar6 = (bool)(bVar6 ^ 1);
    pIn = pOut;
    pOut = pwVar2;
    iVar5 = Var2Pla[(uint)v];
  }
  if (bVar6) {
    uVar3 = 1 << ((char)nVars - 6U & 0x1f);
    if (nVars < 7) {
      uVar3 = 1;
    }
    if (0 < (int)uVar3) {
      uVar4 = 0;
      do {
        pF[uVar4] = pOut[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar3 != uVar4);
    }
  }
  if (Pla2Var[p] == v) {
    return;
  }
  __assert_fail("Pla2Var[p] == v",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec16.c"
                ,0x353,"void If_CluMoveVar(word *, int, int *, int *, int, int)");
}

Assistant:

void If_CluMoveVar( word * pF, int nVars, int * Var2Pla, int * Pla2Var, int v, int p )
{
    word pG[CLU_WRD_MAX], * pIn = pF, * pOut = pG, * pTemp;
    int iPlace0, iPlace1, Count = 0;
    assert( v >= 0 && v < nVars );
    while ( Var2Pla[v] < p )
    {
        iPlace0 = Var2Pla[v];
        iPlace1 = Var2Pla[v]+1;
        If_CluSwapAdjacent( pOut, pIn, iPlace0, nVars );
        pTemp = pIn; pIn = pOut, pOut = pTemp;
        Var2Pla[Pla2Var[iPlace0]]++;
        Var2Pla[Pla2Var[iPlace1]]--;
        Pla2Var[iPlace0] ^= Pla2Var[iPlace1];
        Pla2Var[iPlace1] ^= Pla2Var[iPlace0];
        Pla2Var[iPlace0] ^= Pla2Var[iPlace1];
        Count++;
    }
    while ( Var2Pla[v] > p )
    {
        iPlace0 = Var2Pla[v]-1;
        iPlace1 = Var2Pla[v];
        If_CluSwapAdjacent( pOut, pIn, iPlace0, nVars );
        pTemp = pIn; pIn = pOut, pOut = pTemp;
        Var2Pla[Pla2Var[iPlace0]]++;
        Var2Pla[Pla2Var[iPlace1]]--;
        Pla2Var[iPlace0] ^= Pla2Var[iPlace1];
        Pla2Var[iPlace1] ^= Pla2Var[iPlace0];
        Pla2Var[iPlace0] ^= Pla2Var[iPlace1];
        Count++;
    }
    if ( Count & 1 )
        If_CluCopy( pF, pIn, nVars );
    assert( Pla2Var[p] == v );
}